

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

Rule * slang::ast::RandSeqProductionSymbol::createRule
                 (Rule *__return_storage_ptr__,RsRuleSyntax *syntax,ASTContext *context,
                 StatementBlockSymbol *ruleBlock)

{
  Compilation *dst;
  RsWeightClauseSyntax *pRVar1;
  RandJoinClauseSyntax *pRVar2;
  bool bVar3;
  int iVar4;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> sVar5;
  Rule *pRVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Diagnostic *diag;
  undefined4 extraout_var_01;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> src;
  StatementBlockSymbol *extraout_RDX;
  StatementBlockSymbol *extraout_RDX_00;
  StatementBlockSymbol *extraout_RDX_01;
  StatementBlockSymbol *extraout_RDX_02;
  StatementBlockSymbol *extraout_RDX_03;
  size_t extraout_RDX_04;
  RsIfElseSyntax *ries;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> this;
  Expression *pEVar7;
  bool bVar8;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
  sVar9;
  ProdItem item;
  ProdItem ifItem;
  SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL> prods;
  StatementContext local_108;
  StatementBlockSymbol *local_d0;
  Expression *local_c8;
  StatementBlockSymbol *local_c0;
  Rule *local_b8;
  SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*> local_90 [3];
  
  local_c0 = ruleBlock;
  local_b8 = __return_storage_ptr__;
  sVar9 = Scope::membersOfType<slang::ast::StatementBlockSymbol>(&ruleBlock->super_Scope);
  src = sVar9._M_end.current;
  sVar5 = sVar9._M_begin.current;
  dst = ((context->scope).ptr)->compilation;
  local_90[0].data_ = (pointer)local_90[0].firstElement;
  local_90[0].len = 0;
  local_90[0].cap = 5;
  local_d0 = (StatementBlockSymbol *)src.current;
  if ((syntax->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>._M_extent.
      _M_extent_value != 0) {
    pRVar6 = (Rule *)(*(code *)(&DAT_0048ffdc +
                               *(int *)(&DAT_0048ffdc +
                                       (ulong)(((*(syntax->prods).
                                                  super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>
                                                  ._M_ptr)->super_SyntaxNode).kind - RsCase) * 4)))
                               ();
    return pRVar6;
  }
  pRVar1 = syntax->weightClause;
  if (pRVar1 == (RsWeightClauseSyntax *)0x0) {
    bVar8 = false;
    pEVar7 = (Expression *)0x0;
  }
  else {
    iVar4 = Expression::bind((int)(pRVar1->weight).ptr,(sockaddr *)context,0);
    pEVar7 = (Expression *)CONCAT44(extraout_var,iVar4);
    ASTContext::requireIntegral(context,pEVar7);
    bVar8 = pRVar1->codeBlock != (RsProdSyntax *)0x0;
    src.current = &extraout_RDX->super_Symbol;
  }
  pRVar2 = syntax->randJoin;
  local_c8 = pEVar7;
  if ((pRVar2 == (RandJoinClauseSyntax *)0x0) ||
     (pRVar2->expr == (ParenthesizedExpressionSyntax *)0x0)) {
    pEVar7 = (Expression *)0x0;
  }
  else {
    iVar4 = Expression::bind((int)pRVar2->expr,(sockaddr *)context,0);
    pEVar7 = (Expression *)CONCAT44(extraout_var_00,iVar4);
    bVar3 = Expression::bad(pEVar7);
    src.current = &extraout_RDX_00->super_Symbol;
    if (!bVar3) {
      bVar3 = Type::isNumeric((pEVar7->type).ptr);
      src.current = &extraout_RDX_01->super_Symbol;
      if (!bVar3) {
        diag = ASTContext::addDiag(context,(DiagCode)0xb40006,pEVar7->sourceRange);
        ast::operator<<(diag,(pEVar7->type).ptr);
        src.current = &extraout_RDX_02->super_Symbol;
      }
    }
  }
  if ((StatementBlockSymbol *)sVar5.current != local_d0) {
    this.current = sVar5.current;
    do {
      local_108.lastEventControl.startLoc = (SourceLocation)0x0;
      local_108.lastEventControl.endLoc = (SourceLocation)0x0;
      local_108.blocks._M_ptr = (pointer)0x0;
      local_108.blocks._M_extent._M_extent_value = 0;
      local_108.flags.m_bits = 4;
      local_108.rootAstContext = context;
      StatementBlockSymbol::getStatement((StatementBlockSymbol *)this.current,context,&local_108);
      Statement::StatementContext::~StatementContext(&local_108);
      do {
        this.current = ((Symbol *)&(this.current)->kind)->nextInScope;
        if ((StatementBlockSymbol *)this.current == (StatementBlockSymbol *)0x0) break;
      } while (((Symbol *)&(this.current)->kind)->kind != StatementBlock);
      src.current = &extraout_RDX_03->super_Symbol;
    } while ((StatementBlockSymbol *)this.current != local_d0);
  }
  iVar4 = SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::copy
                    (local_90,(EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)src.current);
  pRVar6 = local_b8;
  (local_b8->ruleBlock).ptr = local_c0;
  (local_b8->prods)._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar4);
  (local_b8->prods)._M_extent._M_extent_value = extraout_RDX_04;
  local_b8->weightExpr = local_c8;
  local_b8->randJoinExpr = pEVar7;
  (local_b8->codeBlock).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>._M_payload.
  _M_value.super_ProdBase.kind = CodeBlock;
  *(Symbol **)
   ((long)&(local_b8->codeBlock).
           super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
           _M_payload.
           super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
           _M_payload + 8) = sVar5.current;
  (local_b8->codeBlock).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>._M_engaged =
       bVar8;
  local_b8->isRandJoin = pRVar2 != (RandJoinClauseSyntax *)0x0;
  if (local_90[0].data_ != (pointer)local_90[0].firstElement) {
    operator_delete(local_90[0].data_);
  }
  return pRVar6;
}

Assistant:

RandSeqProductionSymbol::Rule RandSeqProductionSymbol::createRule(
    const RsRuleSyntax& syntax, const ASTContext& context, const StatementBlockSymbol& ruleBlock) {

    auto blockRange = ruleBlock.membersOfType<StatementBlockSymbol>();
    auto blockIt = blockRange.begin();

    auto& comp = context.getCompilation();
    SmallVector<const ProdBase*> prods;
    for (auto p : syntax.prods) {
        switch (p->kind) {
            case SyntaxKind::RsProdItem:
                prods.push_back(
                    comp.emplace<ProdItem>(createProdItem(p->as<RsProdItemSyntax>(), context)));
                break;
            case SyntaxKind::RsCodeBlock: {
                SLANG_ASSERT(blockIt != blockRange.end());
                prods.push_back(comp.emplace<CodeBlockProd>(*blockIt++));
                break;
            }
            case SyntaxKind::RsIfElse: {
                auto& ries = p->as<RsIfElseSyntax>();
                auto& expr = Expression::bind(*ries.condition, context);
                auto ifItem = createProdItem(*ries.ifItem, context);

                std::optional<ProdItem> elseItem;
                if (ries.elseClause)
                    elseItem = createProdItem(*ries.elseClause->item, context);

                if (!expr.bad())
                    context.requireBooleanConvertible(expr);

                prods.push_back(comp.emplace<IfElseProd>(expr, ifItem, elseItem));
                break;
            }
            case SyntaxKind::RsRepeat: {
                auto& rrs = p->as<RsRepeatSyntax>();
                auto& expr = Expression::bind(*rrs.expr, context);
                auto item = createProdItem(*rrs.item, context);
                prods.push_back(comp.emplace<RepeatProd>(expr, item));

                context.requireIntegral(expr);
                break;
            }
            case SyntaxKind::RsCase:
                prods.push_back(&createCaseProd(p->as<RsCaseSyntax>(), context));
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    const Expression* weightExpr = nullptr;
    std::optional<CodeBlockProd> codeBlock;
    if (auto wc = syntax.weightClause) {
        weightExpr = &Expression::bind(*wc->weight, context);
        context.requireIntegral(*weightExpr);

        if (wc->codeBlock) {
            SLANG_ASSERT(blockIt != blockRange.end());
            codeBlock = CodeBlockProd(*blockIt++);
        }
    }

    bool isRandJoin = false;
    const Expression* randJoinExpr = nullptr;
    if (syntax.randJoin) {
        isRandJoin = true;
        if (syntax.randJoin->expr) {
            randJoinExpr = &Expression::bind(*syntax.randJoin->expr, context);

            if (!randJoinExpr->bad() && !randJoinExpr->type->isNumeric()) {
                context.addDiag(diag::RandJoinNotNumeric, randJoinExpr->sourceRange)
                    << *randJoinExpr->type;
            }
        }
    }

    for (auto& block : blockRange) {
        Statement::StatementContext stmtCtx(context);
        stmtCtx.flags = StatementFlags::InRandSeq;
        block.getStatement(context, stmtCtx);
    }

    return {ruleBlock, prods.copy(comp), weightExpr, randJoinExpr, codeBlock, isRandJoin};
}